

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O0

CNscPStackEntry * NscBuildLocationConstant(int nLocationType)

{
  CNscPStackEntry *this;
  int in_EDI;
  CNscPStackEntry *unaff_retaddr;
  CNscPStackEntry *pOut;
  undefined4 in_stack_ffffffffffffffe8;
  NscType in_stack_ffffffffffffffec;
  CNscContext *in_stack_fffffffffffffff0;
  
  this = CNscContext::GetPStackEntry
                   (in_stack_fffffffffffffff0,
                    (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),0);
  CNscPStackEntry::SetType(this,in_stack_ffffffffffffffec);
  CNscPStackEntry::PushConstantLocation(unaff_retaddr,in_EDI);
  return this;
}

Assistant:

YYSTYPE NscBuildLocationConstant (int nLocationType)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);
	pOut ->SetType (NscType_Engine_2);
	pOut ->PushConstantLocation(nLocationType);
	return pOut;
}